

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int mbedtls_x509_crt_check_key_usage(mbedtls_x509_crt *crt,uint usage)

{
  uint may_mask;
  uint usage_may;
  uint usage_must;
  uint usage_local;
  mbedtls_x509_crt *crt_local;
  
  if ((crt->ext_types & 4U) == 0) {
    crt_local._4_4_ = 0;
  }
  else if ((crt->key_usage & 0xffff7ffe & usage & 0xffff7ffe) == (usage & 0xffff7ffe)) {
    if ((crt->key_usage & 0x8001 | usage & 0x8001) == (usage & 0x8001)) {
      crt_local._4_4_ = 0;
    }
    else {
      crt_local._4_4_ = -0x2800;
    }
  }
  else {
    crt_local._4_4_ = -0x2800;
  }
  return crt_local._4_4_;
}

Assistant:

int mbedtls_x509_crt_check_key_usage( const mbedtls_x509_crt *crt,
                                      unsigned int usage )
{
    unsigned int usage_must, usage_may;
    unsigned int may_mask = MBEDTLS_X509_KU_ENCIPHER_ONLY
                          | MBEDTLS_X509_KU_DECIPHER_ONLY;

    if( ( crt->ext_types & MBEDTLS_X509_EXT_KEY_USAGE ) == 0 )
        return( 0 );

    usage_must = usage & ~may_mask;

    if( ( ( crt->key_usage & ~may_mask ) & usage_must ) != usage_must )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    usage_may = usage & may_mask;

    if( ( ( crt->key_usage & may_mask ) | usage_may ) != usage_may )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    return( 0 );
}